

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

void __thiscall
ON_RenderContentPrivate::InternalSetPropertyValue
          (ON_RenderContentPrivate *this,wchar_t *name,ON_XMLVariant *value)

{
  ON_XMLProperty *pOVar1;
  ON_wString OStack_28;
  
  pOVar1 = ON_XMLNode::GetNamedProperty(&this->m_node,name);
  if (pOVar1 != (ON_XMLProperty *)0x0) {
    (*pOVar1->_vptr_ON_XMLProperty[8])(pOVar1,value);
    return;
  }
  pOVar1 = (ON_XMLProperty *)operator_new(0x68);
  ON_wString::ON_wString(&OStack_28,name);
  ON_XMLProperty::ON_XMLProperty(pOVar1,&OStack_28,value);
  ON_XMLNode::AttachProperty(&this->m_node,pOVar1);
  ON_wString::~ON_wString(&OStack_28);
  return;
}

Assistant:

void ON_RenderContentPrivate::InternalSetPropertyValue(const wchar_t* name, const ON_XMLVariant& value)
{
  // Sets a property on the content node. This is one of:
  //
  // - the material node <material... >
  // - the environment node <environment... >
  // - the texture node <texture... >

  ON_XMLProperty* pProp = m_node.GetNamedProperty(name);
  if (nullptr != pProp)
  {
    pProp->SetValue(value);
  }
  else
  {
    pProp = m_node.AttachProperty(new ON_XMLProperty(name, value));
  }
}